

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::writeFile
          (QMakeEvaluator *this,QString *ctx,QString *fn,OpenMode mode,VfsFlags flags,
          QString *contents)

{
  bool bVar1;
  int iVar2;
  undefined4 in_ECX;
  QMakeVfs *in_RDX;
  QString *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  int id;
  int oldId;
  QString errStr;
  undefined4 in_stack_fffffffffffffef8;
  VfsFlag in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char (*in_stack_ffffffffffffff08) [27];
  QByteArrayView *this_00;
  QMakeVfs *this_01;
  QString *errStr_00;
  undefined8 in_stack_ffffffffffffff28;
  QFlagsStorage<QMakeVfs::VfsFlag> flags_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  VisitReturn local_8c;
  undefined1 local_88 [24];
  storage_type *local_70;
  undefined1 local_60 [48];
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  flags_00.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QByteArrayView *)in_RDI[0x1c].d.ptr;
  this_01 = in_RDX;
  local_10 = in_R8D;
  local_c = in_ECX;
  QFlags<QMakeVfs::VfsFlag>::operator|
            ((QFlags<QMakeVfs::VfsFlag> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
            );
  iVar2 = QMakeVfs::idForFileName(this_01,(QString *)this_00,(VfsFlags)flags_00.i);
  errStr_00 = (QString *)in_RDI[0x1c].d.ptr;
  QFlags<QMakeVfs::VfsFlag>::operator|
            ((QFlags<QMakeVfs::VfsFlag> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
            );
  QMakeVfs::idForFileName
            (this_01,(QString *)this_00,
             (QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>)SUB84((ulong)in_RDX >> 0x20,0));
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2c72ad);
  local_2c = local_c;
  local_30 = local_10;
  bVar1 = QMakeVfs::writeFile((QMakeVfs *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              (int)((ulong)in_RDI >> 0x20),this._4_4_,this._0_4_,(QString *)in_RDX,
                              errStr_00);
  if (bVar1) {
    if (iVar2 != 0) {
      QMakeParser::discardFileFromCache
                ((QMakeParser *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
    }
    local_8c = ReturnTrue;
  }
  else {
    QByteArrayView::QByteArrayView<27ul>(this_00,in_stack_ffffffffffffff08);
    QVar3.m_data = local_70;
    QVar3.m_size = (qsizetype)local_60;
    QString::fromLatin1(QVar3);
    QDir::toNativeSeparators((QString *)local_88);
    QString::arg<QString_const&,QString,QString&>
              (in_RDI,(QString *)in_RDX,errStr_00,(QString *)this_01);
    evalError((QMakeEvaluator *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QString::~QString((QString *)0x2c7397);
    QString::~QString((QString *)0x2c73a4);
    QString::~QString((QString *)0x2c73b1);
    local_8c = ReturnFalse;
  }
  QString::~QString((QString *)0x2c73fc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_8c;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn
QMakeEvaluator::writeFile(const QString &ctx, const QString &fn, QIODevice::OpenMode mode,
                          QMakeVfs::VfsFlags flags, const QString &contents)
{
    int oldId = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsAccessedOnly);
    int id = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsCreate);
    QString errStr;
    if (!m_vfs->writeFile(id, mode, flags, contents, &errStr)) {
        evalError(fL1S("Cannot write %1file %2: %3")
                  .arg(ctx, QDir::toNativeSeparators(fn), errStr));
        return ReturnFalse;
    }
    if (oldId)
        m_parser->discardFileFromCache(oldId);
    return ReturnTrue;
}